

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

vector sptk::swipe::makev(int xSz)

{
  double *pdVar1;
  uint in_EDI;
  vector vVar2;
  vector nw_vector;
  
  pdVar1 = (double *)malloc((long)(int)in_EDI << 3);
  vVar2._4_4_ = 0;
  vVar2.x = in_EDI;
  vVar2.v = pdVar1;
  return vVar2;
}

Assistant:

vector makev(int xSz) {
    vector nw_vector;
    nw_vector.x = xSz;
#if 0
    nw_vector.v = malloc(sizeof(double) * xSz);
#else
    nw_vector.v = (double*) malloc(sizeof(double) * xSz);
#endif
    return(nw_vector);
}